

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  Expr *context;
  pointer *__ptr;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  
  context = (Expr *)operator_new(0x1e8);
  (context->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (context->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (context->loc).filename._M_len = 0;
  (context->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(context->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(context->loc).field_1.field_1.offset + 4) = 0;
  *(undefined8 *)&context->type_ = 0x3c;
  context->_vptr_Expr = (_func_int **)&PTR__TryExpr_0019b138;
  Block::Block((Block *)(context + 1));
  context[6].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  context[6].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  context[6].loc.filename._M_len = 0;
  Var::Var((Var *)&context[6].loc.filename._M_str);
  SetBlockDeclaration(this,(BlockDeclaration *)&context[1].loc.filename._M_str,sig_type);
  local_28._M_head_impl = context;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar1.enum_ != Error) {
    PushLabel(this,Try,(ExprList *)&context[5].super_intrusive_list_base<wabt::Expr>.prev_,context);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = std::make_unique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  PushLabel(LabelType::Try, expr_list, expr);
  return Result::Ok;
}